

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrsubstruct.cpp
# Opt level: O1

void __thiscall
TPZDohrSubstruct<std::complex<long_double>_>::ComputeCoarseStiffness
          (TPZDohrSubstruct<std::complex<long_double>_> *this)

{
  int iVar1;
  long lVar2;
  int64_t newRows;
  TPZMatrix<std::complex<long_double>_> *pTVar3;
  complex<long_double> alpha;
  complex<long_double> beta;
  complex<long_double> *pcVar4;
  ulong uVar5;
  TPZFMatrix<std::complex<long_double>_> temp1;
  undefined6 uStack_fe;
  undefined6 uStack_ee;
  undefined8 local_e8;
  undefined2 uStack_e0;
  undefined6 uStack_de;
  undefined8 local_d8;
  undefined2 uStack_d0;
  undefined6 uStack_ce;
  TPZFMatrix<std::complex<long_double>_> local_c0;
  
  iVar1 = this->fNEquations;
  lVar2 = (this->fCoarseIndex).fNElements;
  local_c0.super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_c0.super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_c0.super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_01845fb8;
  local_c0.fElem = (complex<long_double> *)0x0;
  local_c0.fGiven = (complex<long_double> *)0x0;
  local_c0.fSize = 0;
  local_c0.super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fRow = (long)iVar1;
  local_c0.super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fCol = lVar2;
  TPZVec<int>::TPZVec(&local_c0.fPivot.super_TPZVec<int>,0);
  local_c0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_c0.fPivot.super_TPZVec<int>.fStore = local_c0.fPivot.fExtAlloc;
  local_c0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_c0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_c0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_018462a8;
  local_c0.fWork.fStore = (complex<long_double> *)0x0;
  local_c0.fWork.fNElements = 0;
  local_c0.fWork.fNAlloc = 0;
  uVar5 = lVar2 * iVar1;
  if (uVar5 != 0) {
    local_c0.fElem =
         (complex<long_double> *)operator_new__(-(ulong)(uVar5 >> 0x3b != 0) | uVar5 * 0x20);
    pcVar4 = local_c0.fElem;
    do {
      *(longdouble *)pcVar4->_M_value = (longdouble)0;
      *(longdouble *)((long)pcVar4->_M_value + 0x10) = (longdouble)0;
      pcVar4 = pcVar4 + 1;
    } while (pcVar4 != local_c0.fElem + uVar5);
  }
  newRows = (this->fCoarseIndex).fNElements;
  TPZFMatrix<std::complex<long_double>_>::Resize(&this->fKCi,newRows,newRows);
  pTVar3 = ((this->fStiffness).fRef)->fPointer;
  (*(pTVar3->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x25])
            (pTVar3,&this->fPhiC,&local_c0,0);
  local_e8 = SUB108((longdouble)1,0);
  uStack_e0 = (undefined2)((unkuint10)(longdouble)1 >> 0x40);
  local_d8 = SUB108((longdouble)0,0);
  uStack_d0 = (undefined2)((unkuint10)(longdouble)0 >> 0x40);
  beta._M_value._10_6_ = uStack_fe;
  beta._M_value._8_2_ = uStack_d0;
  beta._M_value._26_6_ = uStack_ee;
  beta._M_value._24_2_ = uStack_d0;
  alpha._M_value._10_6_ = uStack_de;
  alpha._M_value._8_2_ = uStack_e0;
  alpha._M_value._26_6_ = uStack_ce;
  alpha._M_value._24_2_ = uStack_d0;
  alpha._M_value._0_8_ = local_e8;
  alpha._M_value._16_8_ = local_d8;
  beta._M_value._0_8_ = local_d8;
  beta._M_value._16_8_ = local_d8;
  TPZFMatrix<std::complex<long_double>_>::MultAdd
            (&this->fPhiC,&local_c0,&local_c0,&this->fKCi,alpha,beta,1);
  TPZFMatrix<std::complex<long_double>_>::~TPZFMatrix(&local_c0);
  return;
}

Assistant:

void TPZDohrSubstruct<TVar>::ComputeCoarseStiffness() {
	TPZFMatrix<TVar> temp1(fNEquations,fCoarseIndex.NElements());
	fKCi.Resize(fCoarseIndex.NElements(),fCoarseIndex.NElements());
	fStiffness->Multiply(fPhiC,temp1);
#ifdef PZ_LOG
	if(logger.isDebugEnabled())
	{
		std::stringstream sout;
		temp1.Print("stiffness matrix times phi",sout);
		LOGPZ_DEBUG(logger,sout.str())
	}
#endif
	fPhiC.MultAdd(temp1,temp1,fKCi,1,0,1);
#ifdef PZ_LOG
	if(logger.isDebugEnabled())
	{
		std::stringstream sout;
		fKCi.Print("Coarse stiffness matrix",sout);
		LOGPZ_DEBUG(logger,sout.str())
	}
#endif
}